

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O0

LY_ERR lyplg_ext_schema_mount_get_parent_ref(lysc_ext_instance *ext,ly_set **refs)

{
  uint local_74;
  uint32_t sn;
  ly_err_item *err;
  char *value;
  lyd_value_xpath10 *xp_val;
  lyd_node_term *term;
  uint32_t i;
  ly_bool ext_data_free;
  lyd_node *ext_data;
  ly_set *results_set;
  ly_set *snode_set;
  ly_set *pref_set;
  ly_set **pplStack_20;
  LY_ERR rc;
  ly_set **refs_local;
  lysc_ext_instance *ext_local;
  
  snode_set = (ly_set *)0x0;
  results_set = (ly_set *)0x0;
  ext_data = (lyd_node *)0x0;
  pplStack_20 = refs;
  refs_local = (ly_set **)ext;
  pref_set._4_4_ = lyplg_ext_get_data(ext->module->ctx,ext,(void **)&i,(ly_bool *)((long)&term + 7))
  ;
  ext_local._4_4_ = pref_set._4_4_;
  if (pref_set._4_4_ == LY_SUCCESS) {
    pref_set._4_4_ = schema_mount_get_parent_ref((lysc_ext_instance *)refs_local,_i,&snode_set);
    if (((pref_set._4_4_ == LY_SUCCESS) && (snode_set->count != 0)) &&
       (pref_set._4_4_ = ly_set_new((ly_set **)&ext_data), pref_set._4_4_ == LY_SUCCESS)) {
      for (term._0_4_ = 0; (uint)term < snode_set->count; term._0_4_ = (uint)term + 1) {
        xp_val = (lyd_value_xpath10 *)(snode_set->field_2).dnodes[(uint)term];
        value = (char *)((lyd_node *)((long)xp_val + 0x38))->parent;
        pref_set._4_4_ =
             lyplg_type_print_xpath10_value
                       ((lyd_value_xpath10 *)value,LY_VALUE_JSON,(void *)0x0,(char **)&err,
                        (ly_err_item **)&stack0xffffffffffffff90);
        if (pref_set._4_4_ != LY_SUCCESS) goto LAB_00208527;
        pref_set._4_4_ =
             lys_find_xpath(*(ly_ctx **)refs_local[2],(lysc_node *)0x0,(char *)err,0,&results_set);
        if (pref_set._4_4_ != LY_SUCCESS) {
          free(err);
          goto LAB_00208527;
        }
        free(err);
        for (local_74 = 0; local_74 < results_set->count; local_74 = local_74 + 1) {
          pref_set._4_4_ =
               ly_set_add((ly_set *)ext_data,(results_set->field_2).dnodes[local_74],'\0',
                          (uint32_t *)0x0);
          if (pref_set._4_4_ != LY_SUCCESS) goto LAB_00208527;
        }
        ly_set_free(results_set,(_func_void_void_ptr *)0x0);
        results_set = (ly_set *)0x0;
      }
      *pplStack_20 = (ly_set *)ext_data;
    }
LAB_00208527:
    if (pref_set._4_4_ != LY_SUCCESS) {
      ly_set_free((ly_set *)ext_data,(_func_void_void_ptr *)0x0);
    }
    ly_set_free(results_set,(_func_void_void_ptr *)0x0);
    if (term._7_1_ != '\0') {
      lyd_free_all(_i);
    }
    ly_set_free(snode_set,(_func_void_void_ptr *)0x0);
    ext_local._4_4_ = pref_set._4_4_;
  }
  return ext_local._4_4_;
}

Assistant:

LY_ERR
lyplg_ext_schema_mount_get_parent_ref(const struct lysc_ext_instance *ext, struct ly_set **refs)
{
    LY_ERR rc;
    struct ly_set *pref_set = NULL;
    struct ly_set *snode_set = NULL;
    struct ly_set *results_set = NULL;
    struct lyd_node *ext_data;
    ly_bool ext_data_free;

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((rc = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        return rc;
    }

    LY_CHECK_GOTO(rc = schema_mount_get_parent_ref(ext, ext_data, &pref_set), cleanup);
    if (pref_set->count == 0) {
        goto cleanup;
    }

    LY_CHECK_GOTO(rc = ly_set_new(&results_set), cleanup);

    for (uint32_t i = 0; i < pref_set->count; ++i) {
        struct lyd_node_term *term;
        struct lyd_value_xpath10 *xp_val;
        char *value;
        struct ly_err_item *err;

        term = (struct lyd_node_term *)pref_set->dnodes[i];
        LYD_VALUE_GET(&term->value, xp_val);
        LY_CHECK_GOTO(rc = lyplg_type_print_xpath10_value(xp_val, LY_VALUE_JSON, NULL, &value, &err), cleanup);
        LY_CHECK_ERR_GOTO(rc = lys_find_xpath(ext->module->ctx, NULL, value, 0, &snode_set), free(value), cleanup);
        free(value);
        for (uint32_t sn = 0; sn < snode_set->count; sn++) {
            LY_CHECK_GOTO(rc = ly_set_add(results_set, snode_set->snodes[sn], 0, NULL), cleanup);
        }
        ly_set_free(snode_set, NULL);
        snode_set = NULL;
    }

    *refs = results_set;

cleanup:
    if (rc) {
        ly_set_free(results_set, NULL);
    }
    ly_set_free(snode_set, NULL);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    ly_set_free(pref_set, NULL);

    return rc;
}